

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O1

int testEpochsOutOfAllowedSet(void)

{
  bool bVar1;
  NeuralNetwork *nn;
  ostream *poVar2;
  Result res;
  Model m;
  Result local_f0;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_98;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_68;
  Model local_38;
  
  CoreML::Specification::Model::Model(&local_38);
  nn = buildBasicUpdatableNeuralNetworkModel(&local_38);
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl._0_8_ = 0;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0.m_type = INTERFACE_FEATURE_NAME_MISMATCH;
  local_f0.m_reason = UNKNOWN;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
  _M_insert_unique<long>(&local_c8,(long *)&local_f0);
  local_f0.m_type = POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES|FAILED_TO_SERIALIZE;
  local_f0.m_reason = UNKNOWN;
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
  _M_insert_unique<long>(&local_c8,(long *)&local_f0);
  local_f0.m_type = POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES|INVALID_UPDATABLE_MODEL_PARAMETERS;
  local_f0.m_reason = UNKNOWN;
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
  _M_insert_unique<long>(&local_c8,(long *)&local_f0);
  local_f0.m_type = 0x28;
  local_f0.m_reason = UNKNOWN;
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
  _M_insert_unique<long>(&local_c8,(long *)&local_f0);
  addLearningRate<CoreML::Specification::NeuralNetwork>(nn,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl._0_8_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            (nn,kSgdOptimizer,0x14,10,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_98);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_98);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::_Rb_tree
            (&local_68,&local_c8);
  addEpochs<CoreML::Specification::NeuralNetwork>
            (nn,100,0,0,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_68);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_68);
  CoreML::Model::validate(&local_f0,&local_38);
  bVar1 = CoreML::Result::good(&local_f0);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/ParameterTests.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1a1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.m_message._M_dataplus._M_p != &local_f0.m_message.field_2) {
    operator_delete(local_f0.m_message._M_dataplus._M_p,
                    local_f0.m_message.field_2._M_allocated_capacity + 1);
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_c8);
  CoreML::Specification::Model::~Model(&local_38);
  return (uint)bVar1;
}

Assistant:

int testEpochsOutOfAllowedSet() {
    
    Specification::Model m;
    
    // basic neural network model without any updatable model parameters.
    auto nn = buildBasicUpdatableNeuralNetworkModel(m);
    
    std::set<int64_t> allowedValues = std::set<int64_t>();
    allowedValues.insert(10);
    allowedValues.insert(20);
    allowedValues.insert(30);
    allowedValues.insert(40);
    
    addLearningRate(nn, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(nn, Specification::Optimizer::kSgdOptimizer, 20, 10, 100);
    addEpochs(nn, 100, 0, 0, allowedValues);
    
    // expect validation to fail due to conflict in updatable model parameter names.
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}